

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountOverJoin.cpp
# Opt level: O0

void __thiscall CountOverJoin::~CountOverJoin(CountOverJoin *this)

{
  MachineLearningModel *in_RDI;
  
  in_RDI->_vptr_MachineLearningModel = (_func_int **)&PTR__CountOverJoin_001f0b98;
  std::shared_ptr<DTree>::~shared_ptr((shared_ptr<DTree> *)0x19e3fa);
  std::shared_ptr<FactorisedJoin>::~shared_ptr((shared_ptr<FactorisedJoin> *)0x19e408);
  std::shared_ptr<Launcher>::~shared_ptr((shared_ptr<Launcher> *)0x19e416);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  MachineLearningModel::~MachineLearningModel(in_RDI);
  return;
}

Assistant:

CountOverJoin::~CountOverJoin(){}